

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O3

void test_ADynArray_appendADynArray_success_notEnoughCapacity_fn(int _i)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  byte *array;
  char *pcVar4;
  char *expr;
  void *_ck_x;
  byte **ppbVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  byte *pbStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *pcStack_68;
  char *pcStack_60;
  char *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  code *local_38;
  char *local_30;
  char *local_28;
  byte *local_20;
  
  local_48 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_40 = private_ACUtilsTest_ADynArray_free;
  local_30 = (char *)0x5;
  local_38 = private_ACUtilsTest_ADynArray_growStrategy;
  local_28 = (char *)0x5;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_50 = 0x115d8c;
  local_20 = (byte *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,5);
  local_20[0] = 0x30;
  local_20[1] = 0x31;
  local_20[2] = 0x32;
  local_20[3] = 0x33;
  local_20[4] = 0x34;
  uStack_50 = 0x115da6;
  array = (byte *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  array[2] = 0;
  array[0] = 0x35;
  array[1] = 0x36;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  uStack_50 = 0x115dda;
  bVar1 = private_ACUtils_ADynArray_insertArray(&local_48,0xffffffffffffffff,array,3,1);
  if (bVar1 == true) {
    uStack_50 = 0x115df4;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x5c8);
    if (local_30 == (char *)0x8) {
      uStack_50 = 0x115e14;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x5c9);
      if (local_28 == (char *)0x8) {
        uStack_50 = 0x115e34;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x5ca);
        if (local_20 == (byte *)0x0) {
          pcVar8 = "(void*) destArray.buffer != NULL";
          pcVar6 = "(void*) destArray.buffer";
          iVar2 = 0x5cb;
LAB_001160c7:
          uStack_50 = 0;
          local_58 = (char *)0x0;
          pcStack_60 = (char *)0x1160ce;
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,iVar2,"Assertion \'_ck_x != NULL\' failed",
                            "Assertion \'%s\' failed: %s == %#x",pcVar8,pcVar6);
        }
        uStack_50 = 0x115e51;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x5cb);
        pcVar9 = (char *)local_20;
        if (local_20 == (byte *)0x0) {
          pcVar8 = "";
          pcVar9 = "(null)";
        }
        else {
          uStack_50 = 0x115e6e;
          iVar2 = strcmp("0123456",(char *)local_20);
          if (iVar2 == 0) {
            uStack_50 = 0x115e87;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x5cc);
            if (local_38 == (code *)0x0) {
              pcVar8 = "(void*) destArray.growStrategy != NULL";
              pcVar6 = "(void*) destArray.growStrategy";
              iVar2 = 0x5cd;
              goto LAB_001160c7;
            }
            uStack_50 = 0x115ea7;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x5cd);
            uStack_50 = 0x115eb4;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x5ce);
            uStack_50 = 0x115ec1;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x5cf);
            uStack_50 = 0x115ece;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x5d0);
            uVar3 = *array - 0x35;
            if ((uVar3 == 0) && (uVar3 = array[1] - 0x36, uVar3 == 0)) {
              uVar3 = (uint)array[2];
            }
            if (uVar3 != 0) {
              pcVar8 = "\"";
              expr = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar6 = "srcArray.buffer == \"56\"";
              pcVar7 = "srcArray.buffer";
              iVar2 = 0x5d1;
              local_58 = "\"";
              pcStack_60 = "56";
              pcStack_68 = "\"";
              pcStack_70 = "\"56\"";
              pcStack_78 = "\"";
              ppbVar5 = &pbStack_80;
              pbStack_80 = array;
              goto LAB_00116153;
            }
            uStack_50 = 0x115f01;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x5d1);
            uStack_50 = 0x115f0e;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x5d2);
            if (private_ACUtilsTest_ADynArray_reallocCount == 1) {
              uStack_50 = 0x115f30;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x5d3);
              uStack_50 = 0x115f39;
              (*pcStack_40)(local_20);
              private_ACUtilsTest_ADynArray_freeCount = private_ACUtilsTest_ADynArray_freeCount + 1;
              uStack_50 = 0x115f48;
              free(array);
              return;
            }
            pcStack_60 = "1";
            pcVar6 = "private_ACUtilsTest_ADynArray_reallocCount == 1";
            pcVar7 = "private_ACUtilsTest_ADynArray_reallocCount";
            iVar2 = 0x5d3;
            pcVar8 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
            goto LAB_0011614b;
          }
          pcVar8 = "\"";
        }
        expr = 
        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
        ;
        pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
        pcVar6 = "destArray.buffer == \"0123456\"";
        pcVar7 = "destArray.buffer";
        iVar2 = 0x5cc;
        local_58 = "\"";
        pcStack_60 = "0123456";
        pcStack_68 = "\"";
        pcStack_70 = "\"0123456\"";
        ppbVar5 = &pbStack_80;
        pbStack_80 = (byte *)pcVar9;
        pcStack_78 = pcVar8;
        goto LAB_00116153;
      }
      pcVar6 = "destArray.capacity == 8";
      pcVar7 = "destArray.capacity";
      iVar2 = 0x5ca;
      pcVar8 = local_28;
    }
    else {
      pcVar6 = "destArray.size == 8";
      pcVar7 = "destArray.size";
      iVar2 = 0x5c9;
      pcVar8 = local_30;
    }
    pcStack_60 = "8";
    local_58 = (char *)0x8;
  }
  else {
    pcVar8 = (char *)(ulong)bVar1;
    pcStack_60 = "true";
    pcVar6 = 
    "(&srcArray == ((void*)0) ? &destArray != ((void*)0) : private_ACUtils_ADynArray_insertArray(&destArray, ((size_t)-1), (&srcArray)->buffer, (&srcArray)->size, sizeof(*(&destArray)->buffer))) == true"
    ;
    pcVar7 = 
    "(&srcArray == ((void*)0) ? &destArray != ((void*)0) : private_ACUtils_ADynArray_insertArray(&destArray, ((size_t)-1), (&srcArray)->buffer, (&srcArray)->size, sizeof(*(&destArray)->buffer)))"
    ;
    iVar2 = 0x5c8;
LAB_0011614b:
    local_58 = (char *)0x1;
  }
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  ppbVar5 = (byte **)&pcStack_60;
LAB_00116153:
  uStack_50 = 0;
  *(char **)((long)ppbVar5 + -8) = pcVar8;
  *(code **)((long)ppbVar5 + -0x10) = test_ADynArray_appendADynArray_success_nullptrSrcArray_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar4,pcVar6,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_appendADynArray_success_notEnoughCapacity)
{
    struct private_ACUtilsTest_ADynArray_CharArray destArray = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    struct private_ACUtilsTest_ADynArray_CharArray srcArray = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    destArray.size = 5;
    destArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    destArray.capacity = 5;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    destArray.buffer = (char*) destArray.reallocator(nullptr, destArray.capacity);
    memcpy(destArray.buffer, "01234", 5);
    srcArray.size = 3;
    srcArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    srcArray.capacity = 8;
    srcArray.buffer = (char*) srcArray.reallocator(nullptr, srcArray.capacity);
    memcpy(srcArray.buffer, "56", 3);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_appendADynArray(&destArray, &srcArray), true);
    ACUTILSTEST_ASSERT_UINT_EQ(destArray.size, 8);
    ACUTILSTEST_ASSERT_UINT_EQ(destArray.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(destArray.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(destArray.buffer, "0123456");
    ACUTILSTEST_ASSERT_PTR_NONNULL(destArray.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(srcArray.size, 3);
    ACUTILSTEST_ASSERT_UINT_EQ(srcArray.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(srcArray.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(srcArray.buffer, "56");
    ACUTILSTEST_ASSERT_PTR_NONNULL(srcArray.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 1);
    destArray.deallocator(destArray.buffer);
    srcArray.deallocator(srcArray.buffer);
}